

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_flags nk_do_edit(nk_flags *state,nk_command_buffer *out,nk_rect bounds,nk_flags flags,
                   nk_plugin_filter filter,nk_text_edit *edit,nk_style_edit *style,nk_input *in,
                   nk_user_font *font)

{
  uchar uVar1;
  nk_color background;
  nk_color background_00;
  nk_color nVar2;
  nk_plugin_copy p_Var3;
  nk_plugin_paste p_Var4;
  undefined1 auVar5 [16];
  nk_vec2 nVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  float row_height;
  byte bVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  char *pcVar14;
  ulong uVar15;
  nk_color *pnVar16;
  uint uVar17;
  nk_color *pnVar18;
  void *pvVar19;
  uchar uVar20;
  uint uVar21;
  ulong uVar22;
  nk_style_edit *pnVar23;
  nk_color *pnVar24;
  char *pcVar25;
  int iVar26;
  nk_color *pnVar27;
  nk_style_edit *pnVar28;
  nk_color *pnVar29;
  nk_color nVar30;
  long lVar31;
  nk_style_edit *pnVar32;
  bool bVar33;
  bool bVar34;
  float fVar35;
  float fVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 in_XMM0_Dc;
  float extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 in_XMM0_Dd;
  float extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  float fVar39;
  float fVar40;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar41;
  float fVar42;
  nk_rect r;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect r_00;
  nk_rect scroll;
  nk_rect r_01;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect b;
  nk_rect r_02;
  nk_rune unicode_1;
  int glyph_offset;
  nk_rune unicode;
  int glyph_len;
  int in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdd0;
  undefined8 local_218;
  int local_200;
  float local_1fc;
  nk_style_edit *local_1e0;
  undefined8 local_1d8;
  undefined8 local_1c8;
  float fStack_1c0;
  float fStack_1bc;
  nk_rune local_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  ulong local_188;
  uint *local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  nk_flags local_168;
  int local_164;
  int local_160;
  int local_15c;
  undefined1 local_158 [16];
  ulong local_148;
  char *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined1 local_128 [24];
  char *local_110;
  ulong local_108;
  float local_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  nk_style_edit *local_e0;
  nk_style_edit *local_d8;
  char *local_d0;
  nk_text local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  
  auVar7._8_4_ = in_XMM1_Dc;
  auVar7._0_8_ = bounds._8_8_;
  auVar7._12_4_ = in_XMM1_Dd;
  local_180 = state;
  local_128._0_16_ = auVar7;
  if (state == (nk_flags *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5880,
                  "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (out == (nk_command_buffer *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5881,
                  "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  auVar5._8_4_ = in_XMM0_Dc;
  auVar5._0_8_ = bounds._0_8_;
  auVar5._12_4_ = in_XMM0_Dd;
  local_158 = auVar5;
  if (style == (nk_style_edit *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5882,
                  "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  local_1a8 = style->border;
  fVar42 = (style->padding).x;
  fVar39 = (style->padding).y;
  local_128._0_4_ = bounds.w;
  local_128._4_4_ = bounds.h;
  local_98 = (float)local_128._0_4_ - (fVar42 + fVar42 + local_1a8 + local_1a8);
  fStack_94 = (float)local_128._4_4_ - (fVar39 + fVar39 + local_1a8 + local_1a8);
  if (((flags >> 10 & 1) != 0) && (local_98 = local_98 - (style->scrollbar_size).x, local_98 <= 0.0)
     ) {
    local_98 = 0.0;
  }
  local_158._4_4_ = bounds.y;
  local_218 = in;
  fStack_90 = (float)local_128._4_4_;
  fStack_8c = (float)local_128._4_4_;
  row_height = fStack_94;
  if ((flags >> 10 & 1) != 0) {
    row_height = font->height + style->row_padding;
  }
  bVar34 = false;
  local_158._0_4_ = bounds.x;
  if ((((in != (nk_input *)0x0) && (fVar35 = (in->mouse).pos.x, (float)local_158._0_4_ <= fVar35))
      && (fVar35 < (float)local_158._0_4_ + (float)local_128._0_4_)) &&
     (fVar35 = (in->mouse).pos.y, bVar34 = false, (float)local_158._4_4_ <= fVar35)) {
    bVar34 = fVar35 < (float)local_158._4_4_ + (float)local_128._4_4_;
  }
  local_178._0_4_ = (out->clip).x;
  local_178._4_4_ = (out->clip).y;
  uStack_170 = 0;
  local_48._0_4_ = (out->clip).w;
  local_48._4_4_ = (out->clip).h;
  uStack_40 = 0;
  uVar1 = edit->active;
  if (((in != (nk_input *)0x0) && ((in->mouse).buttons[0].clicked != 0)) &&
     ((in->mouse).buttons[0].down != 0)) {
    fVar35 = (in->mouse).pos.x;
    bVar33 = false;
    if (((float)local_158._0_4_ <= fVar35) &&
       (bVar33 = false, fVar35 < (float)local_158._0_4_ + (float)local_128._0_4_)) {
      fVar35 = (in->mouse).pos.y;
      if ((float)local_158._4_4_ <= fVar35) {
        bVar33 = fVar35 < (float)local_128._4_4_ + (float)local_158._4_4_;
      }
      else {
        bVar33 = false;
      }
    }
    edit->active = bVar33;
  }
  if ((uVar1 == '\0') && (edit->active != '\0')) {
    (edit->undo).undo_point = 0;
    (edit->undo).redo_point = 99;
    (edit->undo).undo_char_point = 0;
    (edit->undo).redo_char_point = 999;
    edit->cursor = 0;
    edit->select_start = 0;
    edit->select_end = 0;
    edit->mode = '\0';
    edit->cursor_at_end_of_line = '\0';
    edit->initialized = '\x01';
    edit->has_preferred_x = '\0';
    edit->preferred_x = 0.0;
    edit->single_line = (flags >> 10 & 1) == 0;
    edit->filter = filter;
    (edit->scrollbar).x = 0.0;
    (edit->scrollbar).y = 0.0;
    bVar33 = (flags & 2) == 0;
    if ((flags >> 0xb & 1) != 0) {
      edit->cursor = (edit->string).len;
      local_218 = (nk_input *)0x0;
    }
  }
  else {
    bVar33 = true;
    if (edit->active == '\0') {
      edit->mode = '\0';
    }
  }
  fVar42 = fVar42 + (float)local_158._0_4_ + local_1a8;
  local_1a8 = (float)local_158._4_4_ + fVar39 + local_1a8;
  if ((flags & 1) == 0) {
    uVar20 = '\x01';
    if ((flags >> 9 & 1) != 0) goto LAB_0013af60;
  }
  else {
    uVar20 = '\0';
LAB_0013af60:
    edit->mode = uVar20;
  }
  fVar39 = fVar42 + local_98;
  local_198 = local_1a8 + fStack_94;
  bVar9 = edit->active;
  uVar11 = (uint)(bVar9 == 0);
  local_168 = uVar11 * 5 + 5;
  if ((int)(char)uVar1 == (uint)bVar9) {
    local_168 = uVar11 + 1;
  }
  bVar8 = true;
  fStack_1a4 = (float)local_158._4_4_;
  fStack_1a0 = (float)local_158._4_4_;
  fStack_19c = (float)local_158._4_4_;
  fStack_194 = (float)local_158._4_4_;
  fStack_190 = (float)local_158._4_4_;
  fStack_18c = (float)local_158._4_4_;
  local_88 = fStack_94;
  fStack_84 = fStack_94;
  fStack_80 = fStack_94;
  fStack_7c = fStack_94;
  if (bVar9 != 0 && local_218 != (nk_input *)0x0) {
    iVar13 = (local_218->keyboard).keys[1].down;
    fVar35 = (local_218->mouse).pos.x;
    fVar40 = (local_218->mouse).pos.y;
    bVar34 = (fVar40 < local_198 && local_1a8 <= fVar40) && (fVar35 < fVar39 && fVar42 <= fVar35);
    if (bVar33) {
      if ((fVar40 >= local_198 || local_1a8 > fVar40) || (fVar35 >= fVar39 || fVar42 > fVar35))
      goto LAB_0013b0dd;
      iVar10 = (local_218->mouse).buttons[0].down;
      if (iVar10 == 0) {
LAB_0013c0d0:
        if (((local_218->mouse).buttons[2].clicked == 0) ||
           ((local_218->mouse).buttons[2].down == 0)) goto LAB_0013b0dd;
        nk_textedit_key(edit,NK_KEY_TEXT_WORD_LEFT,0,font,row_height);
        nk_textedit_key(edit,NK_KEY_TEXT_WORD_RIGHT,1,font,row_height);
      }
      else {
        fVar35 = (fVar35 - fVar42) + (edit->scrollbar).x;
        fVar40 = (fVar40 - local_1a8) + (edit->scrollbar).y;
        if ((local_218->mouse).buttons[0].clicked != 0) {
          iVar10 = nk_textedit_locate_coord(edit,fVar35,fVar40,font,row_height);
          edit->cursor = iVar10;
          edit->select_start = iVar10;
          edit->select_end = iVar10;
          edit->has_preferred_x = '\0';
          goto LAB_0013b0dd;
        }
        if ((iVar10 == 0) ||
           ((((fVar41 = (local_218->mouse).delta.x, fVar41 == 0.0 && (!NAN(fVar41))) &&
             (fVar41 = (local_218->mouse).delta.y, fVar41 == 0.0)) && (!NAN(fVar41)))))
        goto LAB_0013c0d0;
        iVar10 = nk_textedit_locate_coord(edit,fVar35,fVar40,font,row_height);
        if (edit->select_start == edit->select_end) {
          edit->select_start = edit->cursor;
        }
        edit->select_end = iVar10;
        edit->cursor = iVar10;
      }
      bVar8 = true;
    }
    else {
      if (edit == (nk_text_edit *)0x0) {
        __assert_fail("state",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                      ,0x57cd,"void nk_textedit_select_all(struct nk_text_edit *)");
      }
      edit->select_start = 0;
      edit->select_end = (edit->string).len;
LAB_0013b0dd:
      bVar8 = false;
    }
    uVar1 = edit->mode;
    lVar31 = 0;
    do {
      if (((nk_keys)lVar31 & NK_KEY_MAX) != NK_KEY_ENTER && local_218 != (nk_input *)0x0) {
        uVar11 = (local_218->keyboard).keys[lVar31].clicked;
        if ((local_218->keyboard).keys[lVar31].down == 0) {
          if (1 < uVar11) goto LAB_0013b118;
        }
        else if (uVar11 != 0) {
LAB_0013b118:
          nk_textedit_key(edit,(nk_keys)lVar31,iVar13,font,row_height);
          bVar8 = true;
        }
      }
      lVar31 = lVar31 + 1;
    } while (lVar31 != 0x1e);
    if (uVar1 != edit->mode) {
      (local_218->keyboard).text_len = 0;
    }
    edit->filter = filter;
    iVar10 = (local_218->keyboard).text_len;
    if (iVar10 != 0) {
      nk_textedit_text(edit,(local_218->keyboard).text,iVar10);
      (local_218->keyboard).text_len = 0;
      bVar8 = true;
    }
    if (local_218 != (nk_input *)0x0) {
      uVar11 = (local_218->keyboard).keys[4].clicked;
      if ((local_218->keyboard).keys[4].down == 0) {
        if (1 < uVar11) goto LAB_0013b1be;
      }
      else if (uVar11 != 0) {
LAB_0013b1be:
        if (iVar13 == 0 || -1 < (char)flags) {
          if ((flags & 4) == 0) {
            nk_textedit_text(edit,"\n",1);
          }
          else {
            local_168 = local_168 + 0x10;
          }
          bVar8 = true;
        }
        else {
          nk_textedit_text(edit,"\n",1);
          bVar8 = true;
        }
      }
    }
    bVar33 = true;
    bVar9 = 1;
    if (local_218 != (nk_input *)0x0) {
      uVar11 = (local_218->keyboard).keys[7].clicked;
      if ((local_218->keyboard).keys[7].down == 0) {
        if (uVar11 < 2) goto LAB_0013b21b;
      }
      else if (uVar11 == 0) {
LAB_0013b21b:
        bVar9 = 1;
        goto LAB_0013b21d;
      }
      bVar9 = 0;
    }
LAB_0013b21d:
    if (local_218 != (nk_input *)0x0) {
      uVar11 = (local_218->keyboard).keys[8].clicked;
      if ((local_218->keyboard).keys[8].down == 0) {
        if (1 < uVar11) goto LAB_0013b23b;
      }
      else if (uVar11 != 0) {
LAB_0013b23b:
        bVar33 = false;
      }
    }
    if ((flags & 0x40) != 0 && !(bool)(bVar9 & bVar33)) {
      iVar13 = edit->select_start;
      iVar10 = edit->select_end;
      iVar12 = iVar10;
      if (iVar13 < iVar10) {
        iVar12 = iVar13;
      }
      pcVar14 = nk_str_at_const(&edit->string,iVar12,(nk_rune *)&local_140,(int *)&local_c8);
      p_Var3 = (edit->clip).copy;
      if (p_Var3 != (nk_plugin_copy)0x0) {
        if (iVar10 < iVar13) {
          iVar10 = iVar13;
        }
        (*p_Var3)((edit->clip).userdata,pcVar14,iVar10 - iVar12);
      }
      if (((!bVar33 && (flags & 1) == 0) && (bVar8 = true, edit->mode != '\0')) &&
         (edit->select_start != edit->select_end)) {
        nk_textedit_delete_selection(edit);
        edit->has_preferred_x = '\0';
      }
    }
    bVar33 = true;
    if (local_218 != (nk_input *)0x0) {
      uVar11 = (local_218->keyboard).keys[9].clicked;
      if ((local_218->keyboard).keys[9].down == 0) {
        if (1 < uVar11) goto LAB_0013b2fc;
      }
      else if (uVar11 != 0) {
LAB_0013b2fc:
        bVar33 = false;
      }
    }
    if (((flags & 0x40) != 0 && !bVar33) &&
       (p_Var4 = (edit->clip).paste, p_Var4 != (nk_plugin_paste)0x0)) {
      (*p_Var4)((edit->clip).userdata,edit);
      bVar8 = true;
    }
    bVar9 = 1;
    if (local_218 != (nk_input *)0x0) {
      uVar11 = (local_218->keyboard).keys[5].clicked;
      if ((local_218->keyboard).keys[5].down == 0) {
        if (1 < uVar11) goto LAB_0013b33e;
      }
      else if (uVar11 != 0) {
LAB_0013b33e:
        bVar9 = 0;
      }
    }
    if (!(bool)((flags & 8) == 0 | bVar9)) {
      nk_textedit_text(edit,"    ",4);
      bVar8 = true;
    }
    bVar8 = !bVar8;
  }
  auVar5 = local_128._0_16_;
  auVar7 = local_158;
  fStack_5c = 0.0;
  fStack_60 = 0.0;
  fStack_64 = 0.0;
  fStack_1c0 = local_178._4_4_ + local_48._4_4_;
  fStack_50 = (float)uStack_170 + (float)uStack_40;
  fStack_4c = uStack_170._4_4_ + uStack_40._4_4_;
  uVar11 = 0x22;
  if (edit->active == '\0') {
    uVar11 = *local_180 & 2 | 4;
  }
  *local_180 = uVar11;
  if (bVar34) {
    *(byte *)local_180 = (byte)*local_180 | 0x12;
  }
  local_68 = fVar42;
  if (fVar42 <= (float)local_178) {
    local_68 = (float)local_178;
  }
  fVar35 = local_1a8;
  if (local_1a8 <= local_178._4_4_) {
    fVar35 = local_178._4_4_;
  }
  local_58 = (float)local_178 + (float)local_48;
  if (fVar39 <= (float)local_178 + (float)local_48) {
    local_58 = fVar39;
  }
  fVar39 = fStack_1c0;
  if (local_198 <= fStack_1c0) {
    fVar39 = local_198;
  }
  iVar13 = (edit->string).len;
  local_148 = 0;
  if ((iVar13 == 0) || ((edit->string).buffer.allocated == 0)) {
    pcVar14 = (char *)0x0;
  }
  else {
    pcVar14 = (char *)(edit->string).buffer.memory.ptr;
  }
  local_58 = local_58 - local_68;
  fVar39 = fVar39 - fVar35;
  if (iVar13 != 0) {
    local_148 = (ulong)(uint)(edit->string).buffer.allocated;
  }
  if (local_58 <= 0.0) {
    local_58 = 0.0;
  }
  if (fVar39 <= 0.0) {
    fVar39 = 0.0;
  }
  local_1c8._4_4_ = fStack_1c0;
  local_1c8._0_4_ = (int)fVar39;
  fStack_1bc = fStack_1c0;
  local_d8 = (nk_style_edit *)&style->active;
  uVar11 = *local_180 & 0x10;
  local_e0 = (nk_style_edit *)&style->hover;
  uVar22 = (ulong)(uVar11 * 2);
  pnVar32 = local_e0;
  if (uVar11 == 0) {
    pnVar32 = style;
  }
  if ((*local_180 & 0x20) != 0) {
    pnVar32 = local_d8;
    uVar22 = 0x40;
  }
  local_198 = fVar35;
  fStack_190 = fStack_1a0;
  fStack_194 = fStack_1a4;
  fStack_18c = fStack_19c;
  local_158 = auVar7;
  local_128._0_16_ = auVar5;
  fStack_54 = fStack_1c0;
  if (*(int *)((long)&(style->normal).type + uVar22) == 0) {
    rect.w = (float)local_128._0_4_;
    rect.h = (float)local_128._4_4_;
    rect.x = (float)local_158._0_4_;
    rect.y = (float)local_158._4_4_;
    nk_stroke_rect(out,rect,style->rounding,style->border,style->border_color);
    auVar5 = local_128._0_16_;
    auVar7 = local_158;
    rect_00.w = (float)local_128._0_4_;
    rect_00.h = (float)local_128._4_4_;
    rect_00.x = (float)local_158._0_4_;
    rect_00.y = (float)local_158._4_4_;
    local_158 = auVar7;
    local_128._0_16_ = auVar5;
    nk_fill_rect(out,rect_00,style->rounding,(pnVar32->normal).data.color);
  }
  else {
    r.w = (float)local_128._0_4_;
    r.h = (float)local_128._4_4_;
    r.x = (float)local_158._0_4_;
    r.y = (float)local_158._4_4_;
    nk_draw_image(out,r,&(pnVar32->normal).data.image,(nk_color)0xffffffff);
  }
  fVar35 = fStack_64;
  iVar13 = (int)font;
  if (edit->active == '\0') {
    iVar10 = (edit->string).len;
    if (iVar10 == 0) {
      uVar11 = 0;
    }
    else {
      uVar11 = (uint)(edit->string).buffer.allocated;
    }
    nVar30.r = '\0';
    nVar30.g = '\0';
    nVar30.b = '\0';
    nVar30.a = '\0';
    if ((iVar10 == 0) || ((edit->string).buffer.allocated == 0)) {
      pnVar32 = (nk_style_edit *)0x0;
    }
    else {
      pnVar32 = (nk_style_edit *)(edit->string).buffer.memory.ptr;
    }
    r_00.y = local_198;
    r_00.x = local_68;
    r_00.h = fVar39;
    r_00.w = local_58;
    nk_push_scissor(out,r_00);
    uVar17 = *local_180 & 0x10;
    uVar21 = uVar17 >> 4;
    pnVar28 = local_e0;
    if (uVar17 == 0) {
      pnVar28 = style;
    }
    bVar34 = (*local_180 & 0x20) == 0;
    lVar31 = 0x2e8;
    if (bVar34) {
      lVar31 = (ulong)uVar21 * 4 + 0x2e0;
    }
    pnVar23 = local_d8;
    uVar22 = 0x40;
    if (bVar34) {
      pnVar23 = pnVar28;
      uVar22 = (ulong)(uVar21 << 5);
    }
    if (*(int *)((long)&(style->normal).type + uVar22) != 1) {
      nVar30 = (pnVar23->normal).data.color;
    }
    nk_edit_draw_text(out,pnVar32,fVar42 - (edit->scrollbar).x,local_1a8 - (edit->scrollbar).y,0.0,
                      (char *)(ulong)uVar11,iVar13,row_height,(nk_user_font *)(ulong)(uint)nVar30,
                      *(nk_color *)((long)&(style->normal).type + lVar31),(nk_color)0x0,
                      in_stack_fffffffffffffdd0);
  }
  else {
    fStack_64 = local_198;
    fStack_60 = fVar35;
    fStack_5c = fStack_194;
    fStack_50 = fStack_54;
    local_fc = local_98 - style->cursor_size;
    iVar10 = edit->select_start;
    local_164 = edit->select_end;
    local_160 = local_164;
    if (iVar10 < local_164) {
      local_160 = iVar10;
    }
    if (local_164 < iVar10) {
      local_164 = iVar10;
    }
    iVar10 = (int)local_148;
    fStack_54 = fVar39;
    fStack_4c = fStack_1c0;
    if (iVar10 == 0 || pcVar14 == (char *)0x0) {
      local_b8 = 0;
      uStack_b0 = 0;
      local_1c8 = (nk_style_edit *)0x0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_198 = 0.0;
      fStack_194 = 0.0;
      fStack_190 = 0.0;
      fStack_18c = 0.0;
      local_1e0 = (nk_style_edit *)0x0;
      pcVar14 = (char *)0x0;
      fVar39 = 0.0;
    }
    else {
      local_1ac = 0;
      iVar12 = nk_utf_decode(pcVar14,&local_1ac,iVar10);
      local_d0 = pcVar14;
      local_1fc = (*font->width)(font->userdata,font->height,pcVar14,iVar12);
      uVar22 = 0;
      if (iVar12 == 0 || iVar10 < 1) {
        local_138 = 0;
        uStack_130 = 0;
        local_f8 = 0;
        uStack_f0 = 0;
        local_b8 = 0;
        uStack_b0 = 0;
        local_a8 = 0;
        uStack_a0 = 0;
        local_198 = 0.0;
        fStack_194 = 0.0;
        fStack_190 = 0.0;
        fStack_18c = 0.0;
        pnVar32 = (nk_style_edit *)0x0;
        local_1e0 = (nk_style_edit *)0x0;
        pcVar14 = (char *)0x0;
        uVar15 = 1;
      }
      else {
        local_f8 = 0;
        uStack_f0 = 0;
        local_188 = 1;
        pcVar14 = (char *)0x0;
        local_1e0 = (nk_style_edit *)0x0;
        pnVar32 = (nk_style_edit *)0x0;
        local_a8 = 0;
        uStack_a0 = 0;
        local_b8 = 0;
        uStack_b0 = 0;
        local_200 = 0;
        fVar39 = 0.0;
        fVar35 = 0.0;
        fVar40 = 0.0;
        fVar41 = 0.0;
        do {
          local_78 = ZEXT416((uint)((float)((int)local_188 + -1) * row_height));
          local_110 = local_d0 + (int)uVar22;
          local_138 = 0;
          uStack_130 = 0;
          local_1c8._0_4_ = (int)uVar22;
          local_108 = uVar22;
          while( true ) {
            pcVar25 = local_d0;
            if (pcVar14 == (char *)0x0) {
              if (local_200 == edit->cursor) {
                nVar6 = nk_text_calculate_text_bounds
                                  (font,local_110,(int)local_1c8 - (int)local_108,row_height,
                                   &local_140,&local_c8.padding,&local_15c,in_stack_fffffffffffffdc8
                                  );
                fVar39 = nVar6.x;
                pcVar14 = pcVar25 + (int)local_1c8;
                fVar35 = (float)local_78._0_4_;
                fVar40 = extraout_XMM0_Dc;
                fVar41 = extraout_XMM0_Dd;
              }
              else {
                pcVar14 = (char *)0x0;
              }
            }
            local_198 = fVar39;
            fStack_194 = fVar35;
            fStack_190 = fVar40;
            fStack_18c = fVar41;
            if (local_1e0 == (nk_style_edit *)0x0) {
              if (edit->select_start == edit->select_end) {
                local_1e0 = (nk_style_edit *)0x0;
              }
              else {
                local_1e0 = (nk_style_edit *)0x0;
                if (local_160 == local_200) {
                  nVar6 = nk_text_calculate_text_bounds
                                    (font,local_110,(int)local_1c8 - (int)local_108,row_height,
                                     &local_140,&local_c8.padding,&local_15c,
                                     in_stack_fffffffffffffdc8);
                  local_a8 = CONCAT44(local_78._0_4_,nVar6.x);
                  uStack_a0 = CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00);
                  local_1e0 = (nk_style_edit *)(pcVar25 + (int)local_1c8);
                }
              }
            }
            if (pnVar32 == (nk_style_edit *)0x0) {
              if (edit->select_start == edit->select_end) {
                pnVar32 = (nk_style_edit *)0x0;
              }
              else {
                pnVar32 = (nk_style_edit *)0x0;
                if (local_164 == local_200) {
                  nVar6 = nk_text_calculate_text_bounds
                                    (font,local_110,(int)local_1c8 - (int)local_108,row_height,
                                     &local_140,&local_c8.padding,&local_15c,
                                     in_stack_fffffffffffffdc8);
                  local_b8 = CONCAT44(local_78._0_4_,nVar6.x);
                  uStack_b0 = CONCAT44(extraout_XMM0_Dd_01,extraout_XMM0_Dc_01);
                  pnVar32 = (nk_style_edit *)(pcVar25 + (int)local_1c8);
                }
              }
            }
            iVar10 = (int)local_148;
            if (local_1ac == 10) break;
            iVar26 = (int)local_1c8 + iVar12;
            local_1c8._0_4_ = iVar26;
            iVar12 = nk_utf_decode(pcVar25 + iVar26,&local_1ac,iVar10 - iVar26);
            fVar36 = (*font->width)(font->userdata,font->height,pcVar25 + iVar26,iVar12);
            local_138 = CONCAT44(local_138._4_4_,(float)local_138._0_4_ + local_1fc);
            uVar15 = local_188;
            if ((iVar10 <= iVar26) ||
               (local_200 = local_200 + 1, fVar39 = local_198, fVar35 = fStack_194,
               fVar40 = fStack_190, fVar41 = fStack_18c, local_1fc = fVar36, iVar12 == 0))
            goto LAB_0013bb99;
          }
          local_188 = (ulong)((int)local_188 + 1);
          uVar11 = (int)local_1c8 + 1;
          iVar12 = nk_utf_decode(pcVar25 + (long)(int)local_1c8 + 1,&local_1ac,iVar10 - uVar11);
          local_1fc = (*font->width)(font->userdata,font->height,pcVar25 + (long)(int)local_1c8 + 1,
                                     iVar12);
          if ((float)local_138._0_4_ <= (float)local_f8) {
            local_138._0_4_ = (nk_color)(float)local_f8;
          }
          local_f8 = CONCAT44(local_f8._4_4_,local_138._0_4_);
          local_138 = 0;
          uStack_130 = 0;
          uVar15 = local_188;
          if (iVar10 <= (int)uVar11) break;
          local_200 = local_200 + 1;
          uVar22 = (ulong)uVar11;
          fVar39 = local_198;
          fVar35 = fStack_194;
          fVar40 = fStack_190;
          fVar41 = fStack_18c;
        } while (iVar12 != 0);
      }
LAB_0013bb99:
      fVar39 = (float)(int)uVar15 * row_height;
      local_1c8 = pnVar32;
      if ((pcVar14 == (char *)0x0) && (edit->cursor == (edit->string).len)) {
        fStack_194 = fVar39 - row_height;
        fStack_18c = 0.0;
        local_198 = (float)local_138._0_4_;
        fStack_190 = local_138._4_4_;
      }
    }
    if (!bVar8) {
      if ((flags >> 8 & 1) == 0) {
        fVar35 = local_fc;
        if (local_fc <= 0.0) {
          fVar35 = 0.0;
        }
        if (local_198 < (edit->scrollbar).x) {
          fVar40 = local_198 - fVar35 * 0.25;
          if (fVar40 <= 0.0) {
            fVar40 = 0.0;
          }
          (edit->scrollbar).x = (float)(int)fVar40;
        }
        fVar40 = (edit->scrollbar).x;
        if (fVar35 + fVar40 <= local_198) {
          fVar40 = fVar35 * 0.25 + fVar40;
          (edit->scrollbar).x = (float)(-(uint)(0.0 < fVar40) & (uint)(float)(int)fVar40);
        }
      }
      else {
        (edit->scrollbar).x = 0.0;
      }
      if ((flags >> 10 & 1) == 0) {
        (edit->scrollbar).y = 0.0;
      }
      else {
        if (fStack_194 < (edit->scrollbar).y) {
          fVar35 = fStack_194 - row_height;
          if (fVar35 <= 0.0) {
            fVar35 = 0.0;
          }
          (edit->scrollbar).y = fVar35;
        }
        fVar35 = (edit->scrollbar).y;
        if (local_88 + fVar35 <= fStack_194) {
          (edit->scrollbar).y = fVar35 + row_height;
        }
      }
    }
    if ((flags >> 10 & 1) != 0) {
      fVar35 = (style->scrollbar_size).x;
      scroll.x = (((float)local_158._0_4_ + (float)local_128._0_4_) - style->border) - fVar35;
      scroll.y = local_1a8;
      scroll.h = fStack_94;
      scroll.w = fVar35;
      fVar39 = nk_do_scrollbarv((nk_flags *)&local_c8,out,scroll,0,(edit->scrollbar).y,fVar39,
                                local_88 * 0.1,local_88 * 0.01,&style->scrollbar,local_218,font);
      (edit->scrollbar).y = fVar39;
    }
    r_01.y = fStack_64;
    r_01.x = local_68;
    r_01.h = fStack_54;
    r_01.w = local_58;
    nk_push_scissor(out,r_01);
    if ((*local_180 & 0x20) == 0) {
      if ((*local_180 & 0x10) == 0) {
        pnVar24 = &style->text_normal;
        pnVar16 = &style->selected_text_normal;
        pnVar18 = &style->selected_normal;
        pnVar29 = &style->cursor_normal;
        pnVar27 = &style->cursor_text_normal;
        pnVar32 = style;
      }
      else {
        pnVar24 = &style->text_hover;
        pnVar16 = &style->selected_text_hover;
        pnVar18 = &style->selected_hover;
        pnVar27 = &style->cursor_text_hover;
        pnVar29 = &style->cursor_hover;
        pnVar32 = local_e0;
      }
    }
    else {
      pnVar24 = &style->text_active;
      pnVar16 = &style->selected_text_hover;
      pnVar18 = &style->selected_hover;
      pnVar29 = &style->cursor_hover;
      pnVar27 = &style->cursor_text_hover;
      pnVar32 = local_d8;
    }
    uVar11 = 0;
    if ((pnVar32->normal).type != NK_STYLE_ITEM_IMAGE) {
      uVar11 = *(uint *)&(pnVar32->normal).data;
    }
    nVar30 = *pnVar29;
    background = *pnVar24;
    local_138 = CONCAT44(local_138._4_4_,*pnVar27);
    if (edit->select_start == edit->select_end) {
      iVar10 = (edit->string).len;
      pcVar25 = (char *)0x0;
      if ((iVar10 == 0) || ((edit->string).buffer.allocated == 0)) {
        pnVar32 = (nk_style_edit *)0x0;
      }
      else {
        pnVar32 = (nk_style_edit *)(edit->string).buffer.memory.ptr;
      }
      if (iVar10 != 0) {
        pcVar25 = (char *)(ulong)(uint)(edit->string).buffer.allocated;
      }
      nk_edit_draw_text(out,pnVar32,fVar42 - (edit->scrollbar).x,local_1a8 - (edit->scrollbar).y,0.0
                        ,pcVar25,iVar13,row_height,(nk_user_font *)(ulong)uVar11,background,
                        (nk_color)0x0,in_stack_fffffffffffffdd0);
LAB_0013bf5c:
      uVar37 = (float)local_178;
      uVar38 = local_178._4_4_;
    }
    else {
      background_00 = *pnVar16;
      nVar2 = *pnVar18;
      uVar37 = (float)local_178;
      uVar38 = local_178._4_4_;
      if (0 < local_160) {
        if ((edit->string).len == 0) {
          pnVar32 = (nk_style_edit *)0x0;
        }
        else if ((edit->string).buffer.allocated == 0) {
          pnVar32 = (nk_style_edit *)0x0;
        }
        else {
          pnVar32 = (nk_style_edit *)(edit->string).buffer.memory.ptr;
        }
        if (local_1e0 == (nk_style_edit *)0x0) {
          __assert_fail("select_begin_ptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                        ,0x59ff,
                        "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                       );
        }
        nk_edit_draw_text(out,pnVar32,fVar42 - (edit->scrollbar).x,local_1a8 - (edit->scrollbar).y,
                          0.0,(char *)(ulong)(uint)((int)local_1e0 - (int)pnVar32),iVar13,row_height
                          ,(nk_user_font *)(ulong)uVar11,background,(nk_color)0x0,
                          in_stack_fffffffffffffdd0);
        uVar37 = (float)local_178;
        uVar38 = local_178._4_4_;
      }
      if (edit->select_start != edit->select_end) {
        if (local_1e0 == (nk_style_edit *)0x0) {
          __assert_fail("select_begin_ptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                        ,0x5a06,
                        "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                       );
        }
        if (local_1c8 == (nk_style_edit *)0x0) {
          iVar10 = (edit->string).len;
          if ((iVar10 == 0) || ((edit->string).buffer.allocated == 0)) {
            pvVar19 = (void *)0x0;
          }
          else {
            pvVar19 = (edit->string).buffer.memory.ptr;
          }
          if (iVar10 == 0) {
            lVar31 = 0;
          }
          else {
            lVar31 = (long)(int)(edit->string).buffer.allocated;
          }
          local_1c8 = (nk_style_edit *)((long)pvVar19 + lVar31);
        }
        nk_edit_draw_text(out,local_1e0,fVar42 - (edit->scrollbar).x,
                          (local_a8._4_4_ + local_1a8) - (edit->scrollbar).y,(float)local_a8,
                          (char *)(ulong)(uint)((int)local_1c8 - (int)local_1e0),iVar13,row_height,
                          (nk_user_font *)(ulong)(uint)nVar2,background_00,(nk_color)0x1,
                          in_stack_fffffffffffffdd0);
        uVar37 = (float)local_178;
        uVar38 = local_178._4_4_;
      }
      if ((edit->select_start != edit->select_end) && (local_164 < (edit->string).len)) {
        iVar10 = (edit->string).len;
        if (iVar10 == 0) {
          iVar12 = 0;
        }
        else if ((edit->string).buffer.allocated == 0) {
          iVar12 = 0;
        }
        else {
          iVar12 = (int)(edit->string).buffer.memory.ptr;
        }
        if (iVar10 == 0) {
          iVar10 = 0;
        }
        else {
          iVar10 = (int)(edit->string).buffer.allocated;
        }
        if (local_1c8 == (nk_style_edit *)0x0) {
          __assert_fail("select_end_ptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                        ,0x5a19,
                        "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                       );
        }
        nk_edit_draw_text(out,local_1c8,fVar42 - (edit->scrollbar).x,
                          (local_b8._4_4_ + local_1a8) - (edit->scrollbar).y,(float)local_b8,
                          (char *)(ulong)(uint)((iVar12 + iVar10) - (int)local_1c8),iVar13,
                          row_height,(nk_user_font *)(ulong)uVar11,background,(nk_color)0x1,
                          in_stack_fffffffffffffdd0);
        goto LAB_0013bf5c;
      }
    }
    if (edit->select_start != edit->select_end) goto LAB_0013c395;
    iVar13 = (edit->string).len;
    if (iVar13 == 0) {
      iVar13 = 0;
    }
    else if ((edit->string).buffer.allocated == 0) {
      iVar13 = 0;
    }
    if (edit->cursor < iVar13) {
      if (pcVar14 == (char *)0x0) {
        __assert_fail("cursor_ptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                      ,0x5a37,
                      "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                     );
      }
      if (*pcVar14 != '\n') {
        iVar13 = nk_utf_decode(pcVar14,(nk_rune *)&local_140,4);
        fVar42 = (fVar42 + local_198) - (edit->scrollbar).x;
        fVar39 = (local_1a8 + fStack_194) - (edit->scrollbar).y;
        fVar35 = (*font->width)(font->userdata,font->height,pcVar14,iVar13);
        local_c8.padding.x = 0.0;
        local_c8.padding.y = 0.0;
        local_c8.text = local_138._0_4_;
        rect_02.h = row_height;
        rect_02.w = fVar35;
        rect_02.x = fVar42;
        rect_02.y = fVar39;
        local_c8.background = nVar30;
        nk_fill_rect(out,rect_02,0.0,nVar30);
        b.w = fVar35;
        b.h = row_height;
        b.x = fVar42;
        b.y = fVar39;
        nk_widget_text(out,b,pcVar14,iVar13,&local_c8,0x11,font);
        goto LAB_0013c38d;
      }
    }
    rect_01.x = (fVar42 + local_198) - (edit->scrollbar).x;
    rect_01.y = ((row_height * 0.5 + local_1a8 + fStack_194) - font->height * 0.5) -
                (edit->scrollbar).y;
    rect_01.h = font->height;
    rect_01.w = style->cursor_size;
    nk_fill_rect(out,rect_01,0.0,nVar30);
  }
LAB_0013c38d:
  uVar37 = (float)local_178;
  uVar38 = local_178._4_4_;
LAB_0013c395:
  r_02.y = (float)uVar38;
  r_02.x = (float)uVar37;
  r_02.w = (float)local_48;
  r_02.h = local_48._4_4_;
  nk_push_scissor(out,r_02);
  return local_168;
}

Assistant:

NK_LIB nk_flags
nk_do_edit(nk_flags *state, struct nk_command_buffer *out,
    struct nk_rect bounds, nk_flags flags, nk_plugin_filter filter,
    struct nk_text_edit *edit, const struct nk_style_edit *style,
    struct nk_input *in, const struct nk_user_font *font)
{
    struct nk_rect area;
    nk_flags ret = 0;
    float row_height;
    char prev_state = 0;
    char is_hovered = 0;
    char select_all = 0;
    char cursor_follow = 0;
    struct nk_rect old_clip;
    struct nk_rect clip;

    NK_ASSERT(state);
    NK_ASSERT(out);
    NK_ASSERT(style);
    if (!state || !out || !style)
        return ret;

    /* visible text area calculation */
    area.x = bounds.x + style->padding.x + style->border;
    area.y = bounds.y + style->padding.y + style->border;
    area.w = bounds.w - (2.0f * style->padding.x + 2 * style->border);
    area.h = bounds.h - (2.0f * style->padding.y + 2 * style->border);
    if (flags & NK_EDIT_MULTILINE)
        area.w = NK_MAX(0, area.w - style->scrollbar_size.x);
    row_height = (flags & NK_EDIT_MULTILINE)? font->height + style->row_padding: area.h;

    /* calculate clipping rectangle */
    old_clip = out->clip;
    nk_unify(&clip, &old_clip, area.x, area.y, area.x + area.w, area.y + area.h);

    /* update edit state */
    prev_state = (char)edit->active;
    is_hovered = (char)nk_input_is_mouse_hovering_rect(in, bounds);
    if (in && in->mouse.buttons[NK_BUTTON_LEFT].clicked && in->mouse.buttons[NK_BUTTON_LEFT].down) {
        edit->active = NK_INBOX(in->mouse.pos.x, in->mouse.pos.y,
                                bounds.x, bounds.y, bounds.w, bounds.h);
    }

    /* (de)activate text editor */
    if (!prev_state && edit->active) {
        const enum nk_text_edit_type type = (flags & NK_EDIT_MULTILINE) ?
            NK_TEXT_EDIT_MULTI_LINE: NK_TEXT_EDIT_SINGLE_LINE;
        nk_textedit_clear_state(edit, type, filter);
        if (flags & NK_EDIT_AUTO_SELECT)
            select_all = nk_true;
        if (flags & NK_EDIT_GOTO_END_ON_ACTIVATE) {
            edit->cursor = edit->string.len;
            in = 0;
        }
    } else if (!edit->active) edit->mode = NK_TEXT_EDIT_MODE_VIEW;
    if (flags & NK_EDIT_READ_ONLY)
        edit->mode = NK_TEXT_EDIT_MODE_VIEW;
    else if (flags & NK_EDIT_ALWAYS_INSERT_MODE)
        edit->mode = NK_TEXT_EDIT_MODE_INSERT;

    ret = (edit->active) ? NK_EDIT_ACTIVE: NK_EDIT_INACTIVE;
    if (prev_state != edit->active)
        ret |= (edit->active) ? NK_EDIT_ACTIVATED: NK_EDIT_DEACTIVATED;

    /* handle user input */
    if (edit->active && in)
    {
        int shift_mod = in->keyboard.keys[NK_KEY_SHIFT].down;
        const float mouse_x = (in->mouse.pos.x - area.x) + edit->scrollbar.x;
        const float mouse_y = (in->mouse.pos.y - area.y) + edit->scrollbar.y;

        /* mouse click handler */
        is_hovered = (char)nk_input_is_mouse_hovering_rect(in, area);
        if (select_all) {
            nk_textedit_select_all(edit);
        } else if (is_hovered && in->mouse.buttons[NK_BUTTON_LEFT].down &&
            in->mouse.buttons[NK_BUTTON_LEFT].clicked) {
            nk_textedit_click(edit, mouse_x, mouse_y, font, row_height);
        } else if (is_hovered && in->mouse.buttons[NK_BUTTON_LEFT].down &&
            (in->mouse.delta.x != 0.0f || in->mouse.delta.y != 0.0f)) {
            nk_textedit_drag(edit, mouse_x, mouse_y, font, row_height);
            cursor_follow = nk_true;
        } else if (is_hovered && in->mouse.buttons[NK_BUTTON_RIGHT].clicked &&
            in->mouse.buttons[NK_BUTTON_RIGHT].down) {
            nk_textedit_key(edit, NK_KEY_TEXT_WORD_LEFT, nk_false, font, row_height);
            nk_textedit_key(edit, NK_KEY_TEXT_WORD_RIGHT, nk_true, font, row_height);
            cursor_follow = nk_true;
        }

        {int i; /* keyboard input */
        int old_mode = edit->mode;
        for (i = 0; i < NK_KEY_MAX; ++i) {
            if (i == NK_KEY_ENTER || i == NK_KEY_TAB) continue; /* special case */
            if (nk_input_is_key_pressed(in, (enum nk_keys)i)) {
                nk_textedit_key(edit, (enum nk_keys)i, shift_mod, font, row_height);
                cursor_follow = nk_true;
            }
        }
        if (old_mode != edit->mode) {
            in->keyboard.text_len = 0;
        }}

        /* text input */
        edit->filter = filter;
        if (in->keyboard.text_len) {
            nk_textedit_text(edit, in->keyboard.text, in->keyboard.text_len);
            cursor_follow = nk_true;
            in->keyboard.text_len = 0;
        }

        /* enter key handler */
        if (nk_input_is_key_pressed(in, NK_KEY_ENTER)) {
            cursor_follow = nk_true;
            if (flags & NK_EDIT_CTRL_ENTER_NEWLINE && shift_mod)
                nk_textedit_text(edit, "\n", 1);
            else if (flags & NK_EDIT_SIG_ENTER)
                ret |= NK_EDIT_COMMITED;
            else nk_textedit_text(edit, "\n", 1);
        }

        /* cut & copy handler */
        {int copy= nk_input_is_key_pressed(in, NK_KEY_COPY);
        int cut = nk_input_is_key_pressed(in, NK_KEY_CUT);
        if ((copy || cut) && (flags & NK_EDIT_CLIPBOARD))
        {
            int glyph_len;
            nk_rune unicode;
            const char *text;
            int b = edit->select_start;
            int e = edit->select_end;

            int begin = NK_MIN(b, e);
            int end = NK_MAX(b, e);
            text = nk_str_at_const(&edit->string, begin, &unicode, &glyph_len);
            if (edit->clip.copy)
                edit->clip.copy(edit->clip.userdata, text, end - begin);
            if (cut && !(flags & NK_EDIT_READ_ONLY)){
                nk_textedit_cut(edit);
                cursor_follow = nk_true;
            }
        }}

        /* paste handler */
        {int paste = nk_input_is_key_pressed(in, NK_KEY_PASTE);
        if (paste && (flags & NK_EDIT_CLIPBOARD) && edit->clip.paste) {
            edit->clip.paste(edit->clip.userdata, edit);
            cursor_follow = nk_true;
        }}

        /* tab handler */
        {int tab = nk_input_is_key_pressed(in, NK_KEY_TAB);
        if (tab && (flags & NK_EDIT_ALLOW_TAB)) {
            nk_textedit_text(edit, "    ", 4);
            cursor_follow = nk_true;
        }}
    }

    /* set widget state */
    if (edit->active)
        *state = NK_WIDGET_STATE_ACTIVE;
    else nk_widget_state_reset(state);

    if (is_hovered)
        *state |= NK_WIDGET_STATE_HOVERED;

    /* DRAW EDIT */
    {const char *text = nk_str_get_const(&edit->string);
    int len = nk_str_len_char(&edit->string);

    {/* select background colors/images  */
    const struct nk_style_item *background;
    if (*state & NK_WIDGET_STATE_ACTIVED)
        background = &style->active;
    else if (*state & NK_WIDGET_STATE_HOVER)
        background = &style->hover;
    else background = &style->normal;

    /* draw background frame */
    if (background->type == NK_STYLE_ITEM_COLOR) {
        nk_stroke_rect(out, bounds, style->rounding, style->border, style->border_color);
        nk_fill_rect(out, bounds, style->rounding, background->data.color);
    } else nk_draw_image(out, bounds, &background->data.image, nk_white);}

    area.w = NK_MAX(0, area.w - style->cursor_size);
    if (edit->active)
    {
        int total_lines = 1;
        struct nk_vec2 text_size = nk_vec2(0,0);

        /* text pointer positions */
        const char *cursor_ptr = 0;
        const char *select_begin_ptr = 0;
        const char *select_end_ptr = 0;

        /* 2D pixel positions */
        struct nk_vec2 cursor_pos = nk_vec2(0,0);
        struct nk_vec2 selection_offset_start = nk_vec2(0,0);
        struct nk_vec2 selection_offset_end = nk_vec2(0,0);

        int selection_begin = NK_MIN(edit->select_start, edit->select_end);
        int selection_end = NK_MAX(edit->select_start, edit->select_end);

        /* calculate total line count + total space + cursor/selection position */
        float line_width = 0.0f;
        if (text && len)
        {
            /* utf8 encoding */
            float glyph_width;
            int glyph_len = 0;
            nk_rune unicode = 0;
            int text_len = 0;
            int glyphs = 0;
            int row_begin = 0;

            glyph_len = nk_utf_decode(text, &unicode, len);
            glyph_width = font->width(font->userdata, font->height, text, glyph_len);
            line_width = 0;

            /* iterate all lines */
            while ((text_len < len) && glyph_len)
            {
                /* set cursor 2D position and line */
                if (!cursor_ptr && glyphs == edit->cursor)
                {
                    int glyph_offset;
                    struct nk_vec2 out_offset;
                    struct nk_vec2 row_size;
                    const char *remaining;

                    /* calculate 2d position */
                    cursor_pos.y = (float)(total_lines-1) * row_height;
                    row_size = nk_text_calculate_text_bounds(font, text+row_begin,
                                text_len-row_begin, row_height, &remaining,
                                &out_offset, &glyph_offset, NK_STOP_ON_NEW_LINE);
                    cursor_pos.x = row_size.x;
                    cursor_ptr = text + text_len;
                }

                /* set start selection 2D position and line */
                if (!select_begin_ptr && edit->select_start != edit->select_end &&
                    glyphs == selection_begin)
                {
                    int glyph_offset;
                    struct nk_vec2 out_offset;
                    struct nk_vec2 row_size;
                    const char *remaining;

                    /* calculate 2d position */
                    selection_offset_start.y = (float)(NK_MAX(total_lines-1,0)) * row_height;
                    row_size = nk_text_calculate_text_bounds(font, text+row_begin,
                                text_len-row_begin, row_height, &remaining,
                                &out_offset, &glyph_offset, NK_STOP_ON_NEW_LINE);
                    selection_offset_start.x = row_size.x;
                    select_begin_ptr = text + text_len;
                }

                /* set end selection 2D position and line */
                if (!select_end_ptr && edit->select_start != edit->select_end &&
                    glyphs == selection_end)
                {
                    int glyph_offset;
                    struct nk_vec2 out_offset;
                    struct nk_vec2 row_size;
                    const char *remaining;

                    /* calculate 2d position */
                    selection_offset_end.y = (float)(total_lines-1) * row_height;
                    row_size = nk_text_calculate_text_bounds(font, text+row_begin,
                                text_len-row_begin, row_height, &remaining,
                                &out_offset, &glyph_offset, NK_STOP_ON_NEW_LINE);
                    selection_offset_end.x = row_size.x;
                    select_end_ptr = text + text_len;
                }
                if (unicode == '\n') {
                    text_size.x = NK_MAX(text_size.x, line_width);
                    total_lines++;
                    line_width = 0;
                    text_len++;
                    glyphs++;
                    row_begin = text_len;
                    glyph_len = nk_utf_decode(text + text_len, &unicode, len-text_len);
                    glyph_width = font->width(font->userdata, font->height, text+text_len, glyph_len);
                    continue;
                }

                glyphs++;
                text_len += glyph_len;
                line_width += (float)glyph_width;

                glyph_len = nk_utf_decode(text + text_len, &unicode, len-text_len);
                glyph_width = font->width(font->userdata, font->height,
                    text+text_len, glyph_len);
                continue;
            }
            text_size.y = (float)total_lines * row_height;

            /* handle case when cursor is at end of text buffer */
            if (!cursor_ptr && edit->cursor == edit->string.len) {
                cursor_pos.x = line_width;
                cursor_pos.y = text_size.y - row_height;
            }
        }
        {
            /* scrollbar */
            if (cursor_follow)
            {
                /* update scrollbar to follow cursor */
                if (!(flags & NK_EDIT_NO_HORIZONTAL_SCROLL)) {
                    /* horizontal scroll */
                    const float scroll_increment = area.w * 0.25f;
                    if (cursor_pos.x < edit->scrollbar.x)
                        edit->scrollbar.x = (float)(int)NK_MAX(0.0f, cursor_pos.x - scroll_increment);
                    if (cursor_pos.x >= edit->scrollbar.x + area.w)
                        edit->scrollbar.x = (float)(int)NK_MAX(0.0f, edit->scrollbar.x + scroll_increment);
                } else edit->scrollbar.x = 0;

                if (flags & NK_EDIT_MULTILINE) {
                    /* vertical scroll */
                    if (cursor_pos.y < edit->scrollbar.y)
                        edit->scrollbar.y = NK_MAX(0.0f, cursor_pos.y - row_height);
                    if (cursor_pos.y >= edit->scrollbar.y + area.h)
                        edit->scrollbar.y = edit->scrollbar.y + row_height;
                } else edit->scrollbar.y = 0;
            }

            /* scrollbar widget */
            if (flags & NK_EDIT_MULTILINE)
            {
                nk_flags ws;
                struct nk_rect scroll;
                float scroll_target;
                float scroll_offset;
                float scroll_step;
                float scroll_inc;

                scroll = area;
                scroll.x = (bounds.x + bounds.w - style->border) - style->scrollbar_size.x;
                scroll.w = style->scrollbar_size.x;

                scroll_offset = edit->scrollbar.y;
                scroll_step = scroll.h * 0.10f;
                scroll_inc = scroll.h * 0.01f;
                scroll_target = text_size.y;
                edit->scrollbar.y = nk_do_scrollbarv(&ws, out, scroll, 0,
                        scroll_offset, scroll_target, scroll_step, scroll_inc,
                        &style->scrollbar, in, font);
            }
        }

        /* draw text */
        {struct nk_color background_color;
        struct nk_color text_color;
        struct nk_color sel_background_color;
        struct nk_color sel_text_color;
        struct nk_color cursor_color;
        struct nk_color cursor_text_color;
        const struct nk_style_item *background;
        nk_push_scissor(out, clip);

        /* select correct colors to draw */
        if (*state & NK_WIDGET_STATE_ACTIVED) {
            background = &style->active;
            text_color = style->text_active;
            sel_text_color = style->selected_text_hover;
            sel_background_color = style->selected_hover;
            cursor_color = style->cursor_hover;
            cursor_text_color = style->cursor_text_hover;
        } else if (*state & NK_WIDGET_STATE_HOVER) {
            background = &style->hover;
            text_color = style->text_hover;
            sel_text_color = style->selected_text_hover;
            sel_background_color = style->selected_hover;
            cursor_text_color = style->cursor_text_hover;
            cursor_color = style->cursor_hover;
        } else {
            background = &style->normal;
            text_color = style->text_normal;
            sel_text_color = style->selected_text_normal;
            sel_background_color = style->selected_normal;
            cursor_color = style->cursor_normal;
            cursor_text_color = style->cursor_text_normal;
        }
        if (background->type == NK_STYLE_ITEM_IMAGE)
            background_color = nk_rgba(0,0,0,0);
        else background_color = background->data.color;


        if (edit->select_start == edit->select_end) {
            /* no selection so just draw the complete text */
            const char *begin = nk_str_get_const(&edit->string);
            int l = nk_str_len_char(&edit->string);
            nk_edit_draw_text(out, style, area.x - edit->scrollbar.x,
                area.y - edit->scrollbar.y, 0, begin, l, row_height, font,
                background_color, text_color, nk_false);
        } else {
            /* edit has selection so draw 1-3 text chunks */
            if (edit->select_start != edit->select_end && selection_begin > 0){
                /* draw unselected text before selection */
                const char *begin = nk_str_get_const(&edit->string);
                NK_ASSERT(select_begin_ptr);
                nk_edit_draw_text(out, style, area.x - edit->scrollbar.x,
                    area.y - edit->scrollbar.y, 0, begin, (int)(select_begin_ptr - begin),
                    row_height, font, background_color, text_color, nk_false);
            }
            if (edit->select_start != edit->select_end) {
                /* draw selected text */
                NK_ASSERT(select_begin_ptr);
                if (!select_end_ptr) {
                    const char *begin = nk_str_get_const(&edit->string);
                    select_end_ptr = begin + nk_str_len_char(&edit->string);
                }
                nk_edit_draw_text(out, style,
                    area.x - edit->scrollbar.x,
                    area.y + selection_offset_start.y - edit->scrollbar.y,
                    selection_offset_start.x,
                    select_begin_ptr, (int)(select_end_ptr - select_begin_ptr),
                    row_height, font, sel_background_color, sel_text_color, nk_true);
            }
            if ((edit->select_start != edit->select_end &&
                selection_end < edit->string.len))
            {
                /* draw unselected text after selected text */
                const char *begin = select_end_ptr;
                const char *end = nk_str_get_const(&edit->string) +
                                    nk_str_len_char(&edit->string);
                NK_ASSERT(select_end_ptr);
                nk_edit_draw_text(out, style,
                    area.x - edit->scrollbar.x,
                    area.y + selection_offset_end.y - edit->scrollbar.y,
                    selection_offset_end.x,
                    begin, (int)(end - begin), row_height, font,
                    background_color, text_color, nk_true);
            }
        }

        /* cursor */
        if (edit->select_start == edit->select_end)
        {
            if (edit->cursor >= nk_str_len(&edit->string) ||
                (cursor_ptr && *cursor_ptr == '\n')) {
                /* draw cursor at end of line */
                struct nk_rect cursor;
                cursor.w = style->cursor_size;
                cursor.h = font->height;
                cursor.x = area.x + cursor_pos.x - edit->scrollbar.x;
                cursor.y = area.y + cursor_pos.y + row_height/2.0f - cursor.h/2.0f;
                cursor.y -= edit->scrollbar.y;
                nk_fill_rect(out, cursor, 0, cursor_color);
            } else {
                /* draw cursor inside text */
                int glyph_len;
                struct nk_rect label;
                struct nk_text txt;

                nk_rune unicode;
                NK_ASSERT(cursor_ptr);
                glyph_len = nk_utf_decode(cursor_ptr, &unicode, 4);

                label.x = area.x + cursor_pos.x - edit->scrollbar.x;
                label.y = area.y + cursor_pos.y - edit->scrollbar.y;
                label.w = font->width(font->userdata, font->height, cursor_ptr, glyph_len);
                label.h = row_height;

                txt.padding = nk_vec2(0,0);
                txt.background = cursor_color;;
                txt.text = cursor_text_color;
                nk_fill_rect(out, label, 0, cursor_color);
                nk_widget_text(out, label, cursor_ptr, glyph_len, &txt, NK_TEXT_LEFT, font);
            }
        }}
    } else {
        /* not active so just draw text */
        int l = nk_str_len_char(&edit->string);
        const char *begin = nk_str_get_const(&edit->string);

        const struct nk_style_item *background;
        struct nk_color background_color;
        struct nk_color text_color;
        nk_push_scissor(out, clip);
        if (*state & NK_WIDGET_STATE_ACTIVED) {
            background = &style->active;
            text_color = style->text_active;
        } else if (*state & NK_WIDGET_STATE_HOVER) {
            background = &style->hover;
            text_color = style->text_hover;
        } else {
            background = &style->normal;
            text_color = style->text_normal;
        }
        if (background->type == NK_STYLE_ITEM_IMAGE)
            background_color = nk_rgba(0,0,0,0);
        else background_color = background->data.color;
        nk_edit_draw_text(out, style, area.x - edit->scrollbar.x,
            area.y - edit->scrollbar.y, 0, begin, l, row_height, font,
            background_color, text_color, nk_false);
    }
    nk_push_scissor(out, old_clip);}
    return ret;
}